

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_3dVector * __thiscall
ON_SubDEdge::ControlNetDirectionFrom
          (ON_3dVector *__return_storage_ptr__,ON_SubDEdge *this,ON_SubDVertex *v)

{
  double dVar1;
  ON_3dVector OStack_28;
  
  if (v != (ON_SubDVertex *)0x0) {
    if (this->m_vertex[1] != (ON_SubDVertex *)0x0 && this->m_vertex[0] == v) {
      ControlNetDirection(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    if (this->m_vertex[0] != (ON_SubDVertex *)0x0 && this->m_vertex[1] == v) {
      ControlNetDirection(&OStack_28,this);
      ON_3dVector::operator-(__return_storage_ptr__,&OStack_28);
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->z = ON_3dVector::NanVector.z;
  dVar1 = ON_3dVector::NanVector.y;
  __return_storage_ptr__->x = ON_3dVector::NanVector.x;
  __return_storage_ptr__->y = dVar1;
  return __return_storage_ptr__;
}

Assistant:

const ON_3dVector ON_SubDEdge::ControlNetDirectionFrom(
  const ON_SubDVertex* v
) const
{
  if (nullptr != v)
  {
    if (v == m_vertex[0] && nullptr != m_vertex[1])
      return ControlNetDirection();
    if (v == m_vertex[1] && nullptr != m_vertex[0])
      return -ControlNetDirection();
  }
  return ON_3dVector::NanVector;
}